

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void rgba_4444_to_abgr_f32
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ALLEGRO_COLOR *pAVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  ALLEGRO_COLOR *pAVar5;
  ushort *puVar6;
  ALLEGRO_COLOR AVar7;
  
  lVar4 = (long)width;
  pAVar5 = (ALLEGRO_COLOR *)((long)dst + (long)(dy * dst_pitch) + (long)dx * 0x10);
  iVar3 = 0;
  if (height < 1) {
    height = 0;
  }
  puVar6 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  for (; iVar3 != height; iVar3 = iVar3 + 1) {
    pAVar1 = pAVar5 + lVar4;
    for (; pAVar5 < pAVar1; pAVar5 = pAVar5 + 1) {
      uVar2 = *puVar6;
      AVar7 = al_map_rgba((uchar)_al_rgb_scale_4[uVar2 >> 0xc],
                          *(uchar *)((long)_al_rgb_scale_4 + (ulong)(uVar2 >> 6 & 0x3c)),
                          *(uchar *)((long)_al_rgb_scale_4 + (ulong)(uVar2 >> 2 & 0x3c)),
                          (uchar)_al_rgb_scale_4[uVar2 & 0xf]);
      *pAVar5 = AVar7;
      puVar6 = puVar6 + 1;
    }
    puVar6 = puVar6 + (src_pitch / 2 - lVar4);
    pAVar5 = pAVar5 + (dst_pitch / 0x10 - lVar4);
  }
  return;
}

Assistant:

static void rgba_4444_to_abgr_f32(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   ALLEGRO_COLOR *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 16 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      ALLEGRO_COLOR *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBA_4444_TO_ABGR_F32(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}